

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dds_comp.cpp
# Opt level: O1

bool __thiscall crnlib::dds_comp::create_dds_tex(dds_comp *this,mipmapped_texture *dds_tex)

{
  vector<crnlib::mip_level_*> *this_00;
  uint uVar1;
  color_quad<unsigned_char,_int> *pcVar2;
  color_quad<unsigned_char,_int> *pcVar3;
  void *p;
  undefined8 uVar4;
  bool bVar5;
  conversion_type conv_type;
  long lVar6;
  crn_comp_params *pcVar7;
  undefined7 extraout_var;
  mip_level *this_01;
  image_u8 *p_00;
  image_u8 *piVar8;
  ulong uVar9;
  crn_comp_params *pcVar10;
  uint uVar11;
  uint uVar12;
  uint *puVar13;
  uint *puVar14;
  ulong uVar15;
  uint uVar16;
  bool bVar17;
  bool bVar18;
  face_vec faces;
  image_u8 images [6] [16];
  image_u8 *local_1298;
  image<crnlib::color_quad<unsigned_char,_int>_> local_1288;
  ulong local_1258;
  mipmapped_texture *local_1250;
  ulong local_1248;
  image_u8 *local_1240;
  image_u8 local_1238 [96];
  
  lVar6 = 0x18;
  do {
    *(undefined8 *)((long)&local_1250 + lVar6) = 0;
    *(undefined8 *)((long)&local_1248 + lVar6) = 0;
    *(undefined4 *)((long)local_1238 + lVar6 + -8) = 0xf;
    *(undefined8 *)((long)&local_1238[0].m_width + lVar6) = 0;
    *(undefined8 *)((long)&local_1238[0].m_pitch + lVar6) = 0;
    *(undefined8 *)((long)&local_1238[0].m_comp_flags + lVar6) = 0;
    lVar6 = lVar6 + 0x30;
  } while (lVar6 != 0x1218);
  bVar17 = this->m_pParams->m_faces == 0;
  local_1250 = dds_tex;
  if (bVar17) {
    uVar11 = 0;
  }
  else {
    piVar8 = local_1238;
    local_1298 = (image_u8 *)0x28;
    uVar9 = 0;
    local_1258 = 0;
    do {
      local_1248 = uVar9;
      pcVar7 = this->m_pParams;
      bVar18 = pcVar7->m_levels != 0;
      local_1240 = piVar8;
      if (bVar18) {
        lVar6 = 0;
        do {
          uVar11 = pcVar7->m_width >> ((byte)lVar6 & 0x1f);
          uVar12 = uVar11 + (uVar11 == 0);
          uVar11 = pcVar7->m_height >> ((byte)lVar6 & 0x1f);
          uVar16 = uVar11 + (uVar11 == 0);
          pcVar2 = *(color_quad<unsigned_char,_int> **)
                    ((long)(pcVar7->m_pImages + -1) + 0x58 + lVar6 * 8 + (long)local_1298);
          if (pcVar2 != (color_quad<unsigned_char,_int> *)0x0) {
            pcVar3 = (piVar8->m_pixel_buf).m_p;
            if (pcVar3 != (color_quad<unsigned_char,_int> *)0x0) {
              crnlib_free(pcVar3);
              (piVar8->m_pixel_buf).m_p = (color_quad<unsigned_char,_int> *)0x0;
              (piVar8->m_pixel_buf).m_size = 0;
              (piVar8->m_pixel_buf).m_capacity = 0;
            }
            piVar8->m_pPixels = pcVar2;
            piVar8->m_width = uVar12;
            piVar8->m_height = uVar16;
            piVar8->m_pitch = uVar12;
            piVar8->m_total = uVar16 * uVar12;
            piVar8->m_comp_flags = 0xf;
            if ((local_1258 & 1) == 0) {
              bVar5 = image_utils::has_alpha(piVar8);
              local_1258 = CONCAT71(extraout_var,bVar5);
            }
          }
          if (pcVar2 == (color_quad<unsigned_char,_int> *)0x0) break;
          pcVar7 = this->m_pParams;
          lVar6 = lVar6 + 1;
          piVar8 = piVar8 + 1;
          bVar18 = (uint)lVar6 < pcVar7->m_levels;
        } while (bVar18);
      }
      if (bVar18) break;
      uVar9 = local_1248 + 1;
      piVar8 = local_1240 + 0x10;
      local_1298 = (image_u8 *)((long)local_1298 + 0x80);
      bVar18 = uVar9 < this->m_pParams->m_faces;
      bVar17 = !bVar18;
    } while (bVar18);
    uVar11 = ((byte)local_1258 & 1) << 3;
  }
  if (bVar17 != false) {
    pcVar7 = this->m_pParams;
    pcVar10 = pcVar7;
    if (pcVar7->m_faces != 0) {
      pcVar10 = this->m_pParams;
      puVar13 = &local_1238[0].m_comp_flags;
      uVar9 = 0;
      do {
        if (pcVar7->m_levels != 0) {
          uVar15 = 0;
          puVar14 = puVar13;
          do {
            *puVar14 = *puVar14 & 0xfffffff7 | uVar11;
            uVar15 = uVar15 + 1;
            puVar14 = puVar14 + 0xc;
          } while (uVar15 < pcVar7->m_levels);
        }
        uVar9 = uVar9 + 1;
        puVar13 = puVar13 + 0xc0;
        pcVar7 = pcVar10;
      } while (uVar9 < pcVar10->m_faces);
    }
    conv_type = image_utils::get_image_conversion_type_from_crn_format(pcVar10->m_format);
    if ((conv_type != cConversion_Invalid) && (this->m_pParams->m_faces != 0)) {
      local_1298 = local_1238;
      uVar9 = 0;
      do {
        if (this->m_pParams->m_levels != 0) {
          uVar15 = 0;
          piVar8 = local_1298;
          do {
            image<crnlib::color_quad<unsigned_char,_int>_>::image(&local_1288,piVar8);
            image_utils::convert_image(&local_1288,conv_type);
            uVar12 = piVar8->m_width;
            piVar8->m_width = local_1288.m_width;
            uVar16 = piVar8->m_height;
            piVar8->m_height = local_1288.m_height;
            local_1288.m_height = uVar16;
            local_1288.m_width = uVar12;
            uVar12 = piVar8->m_pitch;
            piVar8->m_pitch = local_1288.m_pitch;
            uVar16 = piVar8->m_total;
            piVar8->m_total = local_1288.m_total;
            local_1288.m_total = uVar16;
            local_1288.m_pitch = uVar12;
            uVar12 = piVar8->m_comp_flags;
            piVar8->m_comp_flags = local_1288.m_comp_flags;
            pcVar2 = piVar8->m_pPixels;
            piVar8->m_pPixels = local_1288.m_pPixels;
            pcVar3 = (piVar8->m_pixel_buf).m_p;
            (piVar8->m_pixel_buf).m_p = local_1288.m_pixel_buf.m_p;
            uVar16 = (piVar8->m_pixel_buf).m_size;
            (piVar8->m_pixel_buf).m_size = local_1288.m_pixel_buf.m_size;
            uVar1 = (piVar8->m_pixel_buf).m_capacity;
            (piVar8->m_pixel_buf).m_capacity = local_1288.m_pixel_buf.m_capacity;
            local_1288.m_comp_flags = uVar12;
            local_1288.m_pPixels = pcVar2;
            local_1288.m_pixel_buf.m_p = pcVar3;
            local_1288.m_pixel_buf.m_size = uVar16;
            local_1288.m_pixel_buf.m_capacity = uVar1;
            if (pcVar3 != (color_quad<unsigned_char,_int> *)0x0) {
              crnlib_free(pcVar3);
            }
            uVar15 = uVar15 + 1;
            piVar8 = piVar8 + 1;
          } while (uVar15 < this->m_pParams->m_levels);
        }
        uVar9 = uVar9 + 1;
        local_1298 = local_1298 + 0x10;
      } while (uVar9 < this->m_pParams->m_faces);
    }
    uVar12 = this->m_pParams->m_faces;
    local_1288._0_8_ = (vector<crnlib::mip_level_*> *)0x0;
    local_1288.m_pitch = 0;
    local_1288.m_total = 0;
    if (uVar12 != 0) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_1288,uVar12,uVar12 == 1,0x10,(object_mover)0x0,false);
      if (uVar12 != local_1288.m_pitch) {
        memset((vector<crnlib::mip_level_*> *)
               (local_1288._0_8_ + (local_1288._8_8_ & 0xffffffff) * 0x10),0,
               (ulong)(uVar12 - local_1288.m_pitch) << 4);
      }
      local_1288.m_pitch = uVar12;
    }
    if (this->m_pParams->m_faces != 0) {
      local_1298 = local_1238;
      uVar9 = 0;
      do {
        if (this->m_pParams->m_levels != 0) {
          uVar15 = 0;
          piVar8 = local_1298;
          do {
            this_01 = (mip_level *)crnlib_malloc(0x28);
            mip_level::mip_level(this_01);
            p_00 = (image_u8 *)crnlib_malloc(0x30);
            p_00->m_width = 0;
            p_00->m_height = 0;
            p_00->m_pitch = 0;
            p_00->m_total = 0;
            p_00->m_comp_flags = 0xf;
            p_00->m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
            (p_00->m_pixel_buf).m_p = (color_quad<unsigned_char,_int> *)0x0;
            (p_00->m_pixel_buf).m_size = 0;
            (p_00->m_pixel_buf).m_capacity = 0;
            p_00->m_width = piVar8->m_width;
            piVar8->m_width = 0;
            uVar12 = p_00->m_height;
            p_00->m_height = piVar8->m_height;
            piVar8->m_height = uVar12;
            uVar12 = p_00->m_pitch;
            p_00->m_pitch = piVar8->m_pitch;
            piVar8->m_pitch = uVar12;
            uVar12 = p_00->m_total;
            p_00->m_total = piVar8->m_total;
            piVar8->m_total = uVar12;
            uVar12 = p_00->m_comp_flags;
            p_00->m_comp_flags = piVar8->m_comp_flags;
            piVar8->m_comp_flags = uVar12;
            pcVar2 = p_00->m_pPixels;
            p_00->m_pPixels = piVar8->m_pPixels;
            piVar8->m_pPixels = pcVar2;
            pcVar2 = (p_00->m_pixel_buf).m_p;
            (p_00->m_pixel_buf).m_p = (piVar8->m_pixel_buf).m_p;
            (piVar8->m_pixel_buf).m_p = pcVar2;
            uVar12 = (p_00->m_pixel_buf).m_size;
            (p_00->m_pixel_buf).m_size = (piVar8->m_pixel_buf).m_size;
            (piVar8->m_pixel_buf).m_size = uVar12;
            uVar12 = (p_00->m_pixel_buf).m_capacity;
            (p_00->m_pixel_buf).m_capacity = (piVar8->m_pixel_buf).m_capacity;
            (piVar8->m_pixel_buf).m_capacity = uVar12;
            mip_level::assign(this_01,p_00,PIXEL_FMT_INVALID,cDefaultOrientationFlags);
            this_00 = (vector<crnlib::mip_level_*> *)(local_1288._0_8_ + uVar9 * 0x10);
            if (*(uint *)(local_1288._0_8_ + uVar9 * 0x10 + 0xc) <=
                *(uint *)(local_1288._0_8_ + uVar9 * 0x10 + 8)) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)this_00,
                         *(uint *)(local_1288._0_8_ + uVar9 * 0x10 + 8) + 1,true,8,(object_mover)0x0
                         ,false);
            }
            this_00->m_p[this_00->m_size] = this_01;
            this_00->m_size = this_00->m_size + 1;
            uVar15 = uVar15 + 1;
            piVar8 = piVar8 + 1;
          } while (uVar15 < this->m_pParams->m_levels);
        }
        uVar9 = uVar9 + 1;
        local_1298 = local_1298 + 0x10;
      } while (uVar9 < this->m_pParams->m_faces);
    }
    mipmapped_texture::assign(local_1250,(face_vec *)&local_1288);
    uVar4 = local_1288._0_8_;
    if ((vector<crnlib::mip_level_*> *)local_1288._0_8_ != (vector<crnlib::mip_level_*> *)0x0) {
      uVar9 = local_1288._8_8_ & 0xffffffff;
      if (uVar9 != 0) {
        lVar6 = 0;
        do {
          p = *(void **)(uVar4 + lVar6);
          if (p != (void *)0x0) {
            crnlib_free(p);
          }
          lVar6 = lVar6 + 0x10;
        } while (uVar9 << 4 != lVar6);
      }
      crnlib_free((void *)local_1288._0_8_);
    }
  }
  lVar6 = 0x1200;
  do {
    if (*(void **)((long)&local_1248 + lVar6) != (void *)0x0) {
      crnlib_free(*(void **)((long)&local_1248 + lVar6));
    }
    lVar6 = lVar6 + -0x30;
  } while (lVar6 != 0);
  return bVar17;
}

Assistant:

bool dds_comp::create_dds_tex(mipmapped_texture& dds_tex) {
  image_u8 images[cCRNMaxFaces][cCRNMaxLevels];

  bool has_alpha = false;
  for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++) {
    for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++) {
      const uint width = math::maximum(1U, m_pParams->m_width >> level_index);
      const uint height = math::maximum(1U, m_pParams->m_height >> level_index);

      if (!m_pParams->m_pImages[face_index][level_index])
        return false;

      images[face_index][level_index].alias((color_quad_u8*)m_pParams->m_pImages[face_index][level_index], width, height);
      if (!has_alpha)
        has_alpha = image_utils::has_alpha(images[face_index][level_index]);
    }
  }

  for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++)
    for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++)
      images[face_index][level_index].set_component_valid(3, has_alpha);

  image_utils::conversion_type conv_type = image_utils::get_image_conversion_type_from_crn_format((crn_format)m_pParams->m_format);
  if (conv_type != image_utils::cConversion_Invalid) {
    for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++) {
      for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++) {
        image_u8 cooked_image(images[face_index][level_index]);

        image_utils::convert_image(cooked_image, conv_type);

        images[face_index][level_index].swap(cooked_image);
      }
    }
  }

  face_vec faces(m_pParams->m_faces);

  for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++) {
    for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++) {
      mip_level* pMip = crnlib_new<mip_level>();

      image_u8* pImage = crnlib_new<image_u8>();
      pImage->swap(images[face_index][level_index]);
      pMip->assign(pImage);

      faces[face_index].push_back(pMip);
    }
  }

  dds_tex.assign(faces);
#ifdef CRNLIB_BUILD_DEBUG
  CRNLIB_ASSERT(dds_tex.check());
#endif

  return true;
}